

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits_tests.cpp
# Opt level: O2

string * StateName_abi_cxx11_(string *__return_storage_ptr__,ThresholdState state)

{
  allocator<char> *__a;
  char *__s;
  long in_FS_OFFSET;
  allocator<char> local_16;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(state) {
  case DEFINED:
    __s = "DEFINED";
    __a = &local_11;
    break;
  case STARTED:
    __s = "STARTED";
    __a = &local_12;
    break;
  case LOCKED_IN:
    __s = "LOCKED_IN";
    __a = &local_13;
    break;
  case ACTIVE:
    __s = "ACTIVE";
    __a = &local_14;
    break;
  case FAILED:
    __s = "FAILED";
    __a = &local_15;
    break;
  default:
    __s = "";
    __a = &local_16;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string StateName(ThresholdState state)
{
    switch (state) {
    case ThresholdState::DEFINED:   return "DEFINED";
    case ThresholdState::STARTED:   return "STARTED";
    case ThresholdState::LOCKED_IN: return "LOCKED_IN";
    case ThresholdState::ACTIVE:    return "ACTIVE";
    case ThresholdState::FAILED:    return "FAILED";
    } // no default case, so the compiler can warn about missing cases
    return "";
}